

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Iterator __thiscall
Map<int,_bool>::insert(Map<int,_bool> *this,Item **cell,Item *parent,int *key,bool *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  int iVar4;
  Item *pIVar5;
  ItemBlock *pIVar6;
  ulong uVar7;
  Iterator *pIVar8;
  long lVar9;
  Item *pIVar10;
  
  while( true ) {
    if ((cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar4 != 0)) goto LAB_001049df;
    pIVar10 = *cell;
    if (pIVar10 == (Item *)0x0) break;
    lVar9 = 0x18;
    if ((*key <= pIVar10->key) && (lVar9 = 0x10, pIVar10->key <= *key)) {
      pIVar10->value = *value;
      return (Iterator)pIVar10;
    }
    cell = (Item **)((long)&pIVar10->key + lVar9);
    parent = pIVar10;
  }
  pIVar10 = this->freeItem;
  if (pIVar10 == (Item *)0x0) {
    pIVar6 = (ItemBlock *)operator_new__(0x108);
    pIVar6->next = this->blocks;
    this->blocks = pIVar6;
    pIVar10 = (Item *)0x0;
    for (uVar7 = 8; uVar7 < 0x108; uVar7 = uVar7 + 0x40) {
      pIVar6[8].next = (ItemBlock *)pIVar10;
      pIVar10 = (Item *)(pIVar6 + 1);
      pIVar6 = pIVar6 + 8;
    }
  }
  pIVar10->key = *key;
  pIVar10->value = *value;
  pIVar10->parent = parent;
  pIVar10->left = (Item *)0x0;
  pIVar10->right = (Item *)0x0;
  pIVar10->height = 1;
  pIVar10->slope = 0;
  this->freeItem = pIVar10->prev;
  *cell = pIVar10;
  this->_size = this->_size + 1;
  if (parent == (Item *)0x0) {
    pIVar5 = (this->_begin).item;
    if (pIVar5 != &this->endItem) {
      iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0x1a1,"_begin.item == &endItem");
      if (iVar4 != 0) {
LAB_001049df:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pIVar5 = (this->_begin).item;
    }
    pIVar10->prev = (Item *)0x0;
    pIVar10->next = pIVar5;
    (this->_begin).item = pIVar10;
    (this->endItem).prev = pIVar10;
  }
  else {
    pIVar5 = parent;
    if (cell == &parent->right) {
      pIVar5 = parent->next;
    }
    pIVar1 = pIVar5->prev;
    pIVar8 = (Iterator *)&pIVar1->next;
    if (pIVar1 == (Item *)0x0) {
      pIVar8 = &this->_begin;
    }
    pIVar10->prev = pIVar1;
    pIVar8->item = pIVar10;
    pIVar10->next = pIVar5;
    pIVar5->prev = pIVar10;
    while( true ) {
      uVar2 = parent->height;
      Item::updateHeightAndSlope(parent);
      pIVar5 = rebal(this,parent);
      if (uVar2 == pIVar5->height) break;
      parent = pIVar5->parent;
      if (parent == (Item *)0x0) {
        return (Iterator)pIVar10;
      }
    }
  }
  return (Iterator)pIVar10;
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }